

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::add_global(Dispatch_Engine *this,Boxed_Value *obj,string *name)

{
  name_conflict_error *this_00;
  pointer t_name;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Boxed_Value>_>::value,_pair<iterator,_bool>_>
  _Var1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  local_70;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
  local_40;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Boxed_Value>_>::value,_pair<iterator,_bool>_>
  result;
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  string *name_local;
  Boxed_Value *obj_local;
  Dispatch_Engine *this_local;
  
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)&result.second,&this->m_mutex);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_true>
            (&local_70,name,obj);
  _Var1 = std::
          map<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
          ::insert<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>
                    ((map<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                      *)&(this->m_state).m_global_objects,&local_70);
  local_40 = _Var1.first._M_node;
  result.first._M_node._0_1_ = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  ::~pair(&local_70);
  if (((byte)result.first._M_node & 1) == 0) {
    this_00 = (name_conflict_error *)__cxa_allocate_exception(0x30);
    t_name = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
             ::operator->(&local_40);
    chaiscript::exception::name_conflict_error::name_conflict_error(this_00,&t_name->first);
    __cxa_throw(this_00,&chaiscript::exception::name_conflict_error::typeinfo,
                chaiscript::exception::name_conflict_error::~name_conflict_error);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock
            ((unique_lock<std::shared_mutex> *)&result.second);
  return;
}

Assistant:

void add_global(Boxed_Value obj, std::string name) {
        chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        if (auto result = m_state.m_global_objects.insert(std::pair{std::move(name), std::move(obj)}); !result.second) {
          // insert failed
          throw chaiscript::exception::name_conflict_error(result.first->first);
        }
      }